

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::cotDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *deriv;
  expr_node *frac;
  expr_value local_28;
  expr_node *local_20;
  expr_node *local_18;
  
  local_18 = tanDeriv((expr_tree *)frac,deriv);
  (local_18->right->left->value).integer = 9;
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_28,2);
  expr_node::expr_node(this_00,'\x05',&local_28);
  this_00->right = local_18;
  local_20 = this_00;
  Link(this_00,(expr_node *)0x0,this_00->right);
  return local_20;
}

Assistant:

expr_node* expr_tree::cotDeriv(const expr_node* node)
{
    auto frac = tanDeriv(node);
    frac->right->left->value.integer = SIN;
    auto deriv = new expr_node(OP, (long)SUB);
    deriv->right = frac;
    Link(deriv, nullptr, deriv->right);
    return deriv;
}